

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O1

void __thiscall
avro::EnumParser::EnumParser
          (EnumParser *this,ResolverFactory *factory,NodePtr *writer,NodePtr *reader,
          CompoundLayout *offsets)

{
  iterator __position;
  int iVar1;
  const_reference pTVar2;
  undefined4 extraout_var;
  size_type __n;
  undefined4 extraout_var_01;
  ulong uVar3;
  size_t readerIndex;
  unsigned_long local_38;
  undefined4 extraout_var_00;
  
  (this->super_Resolver)._vptr_Resolver = (_func_int **)&PTR_parse_001d30d0;
  pTVar2 = boost::
           ptr_sequence_adapter<avro::Layout,_std::vector<void_*,_std::allocator<void_*>_>,_boost::heap_clone_allocator>
           ::at((ptr_sequence_adapter<avro::Layout,_std::vector<void_*,_std::allocator<void_*>_>,_boost::heap_clone_allocator>
                 *)(offsets + 0x10),0);
  this->offset_ = *(size_t *)(pTVar2 + 8);
  iVar1 = (*reader->px->_vptr_Node[7])();
  this->readerSize_ = CONCAT44(extraout_var,iVar1);
  (this->mapping_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mapping_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mapping_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*writer->px->_vptr_Node[7])();
  __n = CONCAT44(extraout_var_00,iVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&this->mapping_,__n);
  if (__n != 0) {
    uVar3 = 0;
    do {
      iVar1 = (*writer->px->_vptr_Node[8])(writer->px,uVar3 & 0xffffffff);
      local_38 = this->readerSize_;
      (*reader->px->_vptr_Node[9])(reader->px,CONCAT44(extraout_var_01,iVar1),&local_38);
      __position._M_current =
           (this->mapping_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->mapping_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->mapping_,__position
                   ,&local_38);
      }
      else {
        *__position._M_current = local_38;
        (this->mapping_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar3 = uVar3 + 1;
    } while (__n != uVar3);
  }
  return;
}

Assistant:

EnumParser(ResolverFactory &factory, const NodePtr &writer, const NodePtr &reader, const CompoundLayout &offsets) :
        Resolver(),
        offset_(offsets.at(0).offset()),
        readerSize_(reader->names())
    { 
        const size_t writerSize = writer->names();

        mapping_.reserve(writerSize);

        for(size_t i = 0; i < writerSize; ++i) {
            const std::string &name = writer->nameAt(i);
            size_t readerIndex = readerSize_;
            reader->nameIndex(name, readerIndex);
            mapping_.push_back(readerIndex);
        }
    }